

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAPI.c
# Opt level: O3

int Cudd_StdPostReordHook(DdManager *dd,char *str,void *data)

{
  FILE *__stream;
  int iVar1;
  abctime aVar2;
  ulong uVar3;
  
  aVar2 = Extra_CpuTime();
  __stream = (FILE *)dd->out;
  iVar1 = strcmp(str,"BDD");
  if (iVar1 == 0) {
    uVar3 = Cudd_ReadNodeCount(dd);
  }
  else {
    uVar3 = (ulong)((dd->keysZ - dd->deadZ) + 2);
  }
  iVar1 = fprintf(__stream,"%ld nodes in %g sec\n",(double)(aVar2 - (long)data) / 1000.0,uVar3);
  if (iVar1 != -1) {
    fflush((FILE *)dd->out);
  }
  return 0;
}

Assistant:

int
Cudd_StdPostReordHook(
  DdManager *dd,
  const char *str,
  void *data)
{
    long initialTime = (long) data;
    int retval;
    long finalTime = util_cpu_time();
    double totalTimeSec = (double)(finalTime - initialTime) / 1000.0;

    retval = fprintf(dd->out,"%ld nodes in %g sec\n", strcmp(str, "BDD") == 0 ?
                     Cudd_ReadNodeCount(dd) : Cudd_zddReadNodeCount(dd),
                     totalTimeSec);
    if (retval == EOF) return(0);
    retval = fflush(dd->out);
    if (retval == EOF) return(0);
    return(1);

}